

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O2

void pzgeom::TPZQuadraticTetra::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  uint uVar1;
  Fad<double> *pFVar2;
  long lVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  ulong row;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_6a8;
  TPZFNMatrix<10,_Fad<double>_> phi;
  TPZFNMatrix<30,_Fad<double>_> dphi;
  
  TPZFNMatrix<10,_Fad<double>_>::TPZFNMatrix(&phi,10,1);
  TPZFNMatrix<30,_Fad<double>_>::TPZFNMatrix(&dphi,3,10);
  TShape<Fad<double>>(loc,&phi.super_TPZFMatrix<Fad<double>_>,&dphi.super_TPZFMatrix<Fad<double>_>);
  uVar1 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x20) {
    local_6a8.fadexpr_.left_ = (Fad<double> *)0x0;
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)((long)&x->fStore->val_ + lVar3),(double *)&local_6a8);
  }
  row = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = row;
  }
  for (; row != 10; row = row + 1) {
    lVar3 = 0;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pFVar2 = TPZFMatrix<Fad<double>_>::operator()(&phi.super_TPZFMatrix<Fad<double>_>,row,0);
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,uVar4,row);
      local_6a8.fadexpr_.right_.defaultVal = 0.0;
      local_6a8.fadexpr_.left_ = pFVar2;
      Fad<double>::operator+=((Fad<double> *)((long)&x->fStore->val_ + lVar3),&local_6a8);
      lVar3 = lVar3 + 0x20;
    }
  }
  TPZFNMatrix<30,_Fad<double>_>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<10,_Fad<double>_>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

void TPZQuadraticTetra::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
    
    TPZFNMatrix<10,T> phi(NNodes,1);
    TPZFNMatrix<30,T> dphi(3,NNodes);
    TShape(loc,phi,dphi);
    int space = nodes.Rows();
    for (int i=0; i<3; i++) {
        x[i] = 0.;
    }
    for(int j = 0; j < NNodes; j++) {
        for(int i = 0; i < space; i++) {
            x[i] += phi(j,0)*nodes.GetVal(i,j);
        }
    }
}